

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  _func_int **pp_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  void *pvVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [32];
  undefined1 (*pauVar39) [16];
  int iVar40;
  uint uVar41;
  int q;
  long lVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar51 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Mat local_78;
  undefined1 auVar50 [64];
  
  iVar31 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar31 == 2) {
      uVar37 = 0;
      iVar35 = bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        iVar35 = 0;
      }
      pp_Var8 = this->_vptr_BatchNorm_x86_avx;
      uVar36 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar36 = uVar37;
      }
      for (; uVar37 != uVar36; uVar37 = uVar37 + 1) {
        pfVar1 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var8[-3]) + uVar37 * 0x10);
        fVar6 = *pfVar1;
        fVar7 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var8[-3]) + uVar37 * 0x10);
        fVar11 = *pfVar1;
        fVar12 = pfVar1[1];
        fVar13 = pfVar1[2];
        fVar45 = pfVar1[3];
        pauVar39 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar37 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        iVar40 = iVar35;
        while (bVar43 = iVar40 != 0, iVar40 = iVar40 + -1, bVar43) {
          auVar47._0_4_ = fVar11 * *(float *)*pauVar39 + fVar6;
          auVar47._4_4_ = fVar12 * *(float *)((long)*pauVar39 + 4) + fVar7;
          auVar47._8_4_ = fVar13 * *(float *)((long)*pauVar39 + 8) + fVar9;
          auVar47._12_4_ = fVar45 * *(float *)((long)*pauVar39 + 0xc) + fVar10;
          *pauVar39 = auVar47;
          pauVar39 = pauVar39 + 1;
        }
      }
    }
    else if (iVar31 == 1) {
      pp_Var8 = this->_vptr_BatchNorm_x86_avx;
      uVar36 = 0;
      uVar37 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar37 = uVar36;
      }
      for (; uVar37 * 0x10 != uVar36; uVar36 = uVar36 + 0x10) {
        pfVar1 = (float *)((long)bottom_top_blob->data + uVar36);
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar9 = pfVar1[3];
        pfVar2 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var8[-3]) + uVar36);
        fVar10 = pfVar2[1];
        fVar11 = pfVar2[2];
        fVar12 = pfVar2[3];
        pfVar3 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var8[-3]) + uVar36);
        fVar13 = pfVar3[1];
        fVar45 = pfVar3[2];
        fVar14 = pfVar3[3];
        pfVar4 = (float *)((long)bottom_top_blob->data + uVar36);
        *pfVar4 = *pfVar1 * *pfVar2 + *pfVar3;
        pfVar4[1] = fVar6 * fVar10 + fVar13;
        pfVar4[2] = fVar7 * fVar11 + fVar45;
        pfVar4[3] = fVar9 * fVar12 + fVar14;
      }
    }
    if (iVar31 - 3U < 2) {
      uVar41 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      uVar36 = 0;
      uVar37 = (ulong)uVar41;
      if ((int)uVar41 < 1) {
        uVar37 = uVar36;
      }
      uVar34 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar34 = uVar36;
      }
      for (; uVar36 != uVar34; uVar36 = uVar36 + 1) {
        puVar5 = (undefined8 *)
                 (*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx[-3]) +
                 uVar36 * 0x10);
        uVar26 = *puVar5;
        uVar27 = puVar5[1];
        puVar5 = (undefined8 *)
                 (*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx[-3]) +
                 uVar36 * 0x10);
        uVar28 = *puVar5;
        uVar29 = puVar5[1];
        Mat::channel(&local_78,bottom_top_blob,(int)uVar36);
        pauVar38 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        local_b8 = (float)uVar28;
        fStack_b4 = (float)((ulong)uVar28 >> 0x20);
        fStack_b0 = (float)uVar29;
        fStack_ac = (float)((ulong)uVar29 >> 0x20);
        local_98 = (float)uVar26;
        fStack_94 = (float)((ulong)uVar26 >> 0x20);
        fStack_90 = (float)uVar27;
        fStack_8c = (float)((ulong)uVar27 >> 0x20);
        uVar33 = uVar37;
        while (iVar31 = (int)uVar33, uVar33 = (ulong)(iVar31 - 1), iVar31 != 0) {
          fVar6 = *(float *)(*pauVar38 + 4);
          fVar7 = *(float *)(*pauVar38 + 8);
          fVar9 = *(float *)(*pauVar38 + 0xc);
          *(float *)*pauVar38 = local_b8 * *(float *)*pauVar38 + local_98;
          *(float *)(*pauVar38 + 4) = fStack_b4 * fVar6 + fStack_94;
          *(float *)(*pauVar38 + 8) = fStack_b0 * fVar7 + fStack_90;
          *(float *)(*pauVar38 + 0xc) = fStack_ac * fVar9 + fStack_8c;
          pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
        }
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar31 == 2) {
      uVar37 = 0;
      iVar35 = bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        iVar35 = 0;
      }
      pp_Var8 = this->_vptr_BatchNorm_x86_avx;
      uVar36 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar36 = uVar37;
      }
      for (; uVar37 != uVar36; uVar37 = uVar37 + 1) {
        pfVar1 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var8[-3]) + uVar37 * 0x20);
        fVar6 = *pfVar1;
        fVar7 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        fVar11 = pfVar1[4];
        fVar12 = pfVar1[5];
        fVar13 = pfVar1[6];
        fVar45 = pfVar1[7];
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var8[-3]) + uVar37 * 0x20);
        fVar14 = *pfVar1;
        fVar15 = pfVar1[1];
        fVar16 = pfVar1[2];
        fVar17 = pfVar1[3];
        fVar18 = pfVar1[4];
        fVar19 = pfVar1[5];
        fVar20 = pfVar1[6];
        pauVar38 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar37 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        iVar40 = iVar35;
        while (bVar43 = iVar40 != 0, iVar40 = iVar40 + -1, bVar43) {
          auVar49._0_4_ = fVar14 * *(float *)*pauVar38 + fVar6;
          auVar49._4_4_ = fVar15 * *(float *)((long)*pauVar38 + 4) + fVar7;
          auVar49._8_4_ = fVar16 * *(float *)((long)*pauVar38 + 8) + fVar9;
          auVar49._12_4_ = fVar17 * *(float *)((long)*pauVar38 + 0xc) + fVar10;
          auVar49._16_4_ = fVar18 * *(float *)((long)*pauVar38 + 0x10) + fVar11;
          auVar49._20_4_ = fVar19 * *(float *)((long)*pauVar38 + 0x14) + fVar12;
          auVar49._24_4_ = fVar20 * *(float *)((long)*pauVar38 + 0x18) + fVar13;
          auVar49._28_4_ = in_ZMM2._28_4_ + fVar45;
          in_ZMM2 = ZEXT3264(auVar49);
          *pauVar38 = auVar49;
          pauVar38 = pauVar38 + 1;
        }
      }
    }
    else if (iVar31 == 1) {
      pp_Var8 = this->_vptr_BatchNorm_x86_avx;
      uVar36 = 0;
      uVar37 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar37 = uVar36;
      }
      for (; uVar37 * 0x20 != uVar36; uVar36 = uVar36 + 0x20) {
        pfVar1 = (float *)((long)bottom_top_blob->data + uVar36);
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar9 = pfVar1[3];
        fVar10 = pfVar1[4];
        fVar11 = pfVar1[5];
        fVar12 = pfVar1[6];
        fVar13 = pfVar1[7];
        pfVar2 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var8[-3]) + uVar36);
        fVar45 = pfVar2[1];
        fVar14 = pfVar2[2];
        fVar15 = pfVar2[3];
        fVar16 = pfVar2[4];
        fVar17 = pfVar2[5];
        fVar18 = pfVar2[6];
        pfVar3 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var8[-3]) + uVar36);
        fVar19 = pfVar3[1];
        fVar20 = pfVar3[2];
        fVar21 = pfVar3[3];
        fVar22 = pfVar3[4];
        fVar23 = pfVar3[5];
        fVar24 = pfVar3[6];
        fVar25 = pfVar3[7];
        pfVar4 = (float *)((long)bottom_top_blob->data + uVar36);
        *pfVar4 = *pfVar1 * *pfVar2 + *pfVar3;
        pfVar4[1] = fVar6 * fVar45 + fVar19;
        pfVar4[2] = fVar7 * fVar14 + fVar20;
        pfVar4[3] = fVar9 * fVar15 + fVar21;
        pfVar4[4] = fVar10 * fVar16 + fVar22;
        pfVar4[5] = fVar11 * fVar17 + fVar23;
        pfVar4[6] = fVar12 * fVar18 + fVar24;
        pfVar4[7] = fVar13 + fVar25;
      }
    }
    if (iVar31 - 3U < 2) {
      uVar41 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      uVar36 = 0;
      uVar37 = (ulong)uVar41;
      if ((int)uVar41 < 1) {
        uVar37 = uVar36;
      }
      uVar34 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar34 = uVar36;
      }
      for (; uVar36 != uVar34; uVar36 = uVar36 + 1) {
        puVar5 = (undefined8 *)
                 (*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx[-3]) +
                 uVar36 * 0x20);
        uVar26 = *puVar5;
        uVar27 = puVar5[1];
        uVar28 = puVar5[2];
        uVar29 = puVar5[3];
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx[-3]) +
                          uVar36 * 0x20);
        fVar6 = *pfVar1;
        fVar7 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        fVar11 = pfVar1[4];
        fVar12 = pfVar1[5];
        fVar13 = pfVar1[6];
        fVar45 = 0.0;
        Mat::channel(&local_78,bottom_top_blob,(int)uVar36);
        pauVar38 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        local_98 = (float)uVar26;
        fStack_94 = (float)((ulong)uVar26 >> 0x20);
        fStack_90 = (float)uVar27;
        fStack_8c = (float)((ulong)uVar27 >> 0x20);
        fStack_88 = (float)uVar28;
        fStack_84 = (float)((ulong)uVar28 >> 0x20);
        fStack_80 = (float)uVar29;
        fStack_7c = (float)((ulong)uVar29 >> 0x20);
        uVar33 = uVar37;
        while (iVar31 = (int)uVar33, uVar33 = (ulong)(iVar31 - 1), iVar31 != 0) {
          fVar14 = *(float *)(*pauVar38 + 4);
          fVar15 = *(float *)(*pauVar38 + 8);
          fVar16 = *(float *)(*pauVar38 + 0xc);
          fVar17 = *(float *)(*pauVar38 + 0x10);
          fVar18 = *(float *)(*pauVar38 + 0x14);
          fVar19 = *(float *)(*pauVar38 + 0x18);
          fVar45 = fVar45 + fStack_7c;
          *(float *)*pauVar38 = fVar6 * *(float *)*pauVar38 + local_98;
          *(float *)(*pauVar38 + 4) = fVar7 * fVar14 + fStack_94;
          *(float *)(*pauVar38 + 8) = fVar9 * fVar15 + fStack_90;
          *(float *)(*pauVar38 + 0xc) = fVar10 * fVar16 + fStack_8c;
          *(float *)(*pauVar38 + 0x10) = fVar11 * fVar17 + fStack_88;
          *(float *)(*pauVar38 + 0x14) = fVar12 * fVar18 + fStack_84;
          *(float *)(*pauVar38 + 0x18) = fVar13 * fVar19 + fStack_80;
          *(float *)(*pauVar38 + 0x1c) = fVar45;
          pauVar38 = pauVar38 + 1;
        }
      }
    }
  }
  else {
    if (iVar31 - 5U < 0xfffffffe) {
      iVar31 = BatchNorm::forward_inplace
                         ((BatchNorm *)
                          ((long)&this->_vptr_BatchNorm_x86_avx +
                          (long)this->_vptr_BatchNorm_x86_avx[-3]),bottom_top_blob,opt);
      return iVar31;
    }
    iVar31 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    for (lVar42 = 0; lVar42 < *(int *)(&this->field_0xd0 + (long)this->_vptr_BatchNorm_x86_avx[-3]);
        lVar42 = lVar42 + 1) {
      auVar50 = ZEXT1664(in_ZMM2._0_16_);
      Mat::channel(&local_78,bottom_top_blob,(int)lVar42);
      pvVar30 = local_78.data;
      Mat::~Mat(&local_78);
      fVar6 = *(float *)(*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_avx[-3]) +
                        lVar42 * 4);
      auVar44._4_4_ = fVar6;
      auVar44._0_4_ = fVar6;
      auVar44._8_4_ = fVar6;
      auVar44._12_4_ = fVar6;
      fVar7 = *(float *)(*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_avx[-3]) +
                        lVar42 * 4);
      auVar46._4_4_ = fVar7;
      auVar46._0_4_ = fVar7;
      auVar46._8_4_ = fVar7;
      auVar46._12_4_ = fVar7;
      lVar32 = 0;
      pauVar38 = (undefined1 (*) [32])pvVar30;
      for (iVar35 = 0; iVar35 + 7 < iVar31; iVar35 = iVar35 + 8) {
        auVar48._0_4_ = fVar7 * *(float *)*pauVar38 + fVar6;
        auVar48._4_4_ = fVar7 * *(float *)(*pauVar38 + 4) + fVar6;
        auVar48._8_4_ = fVar7 * *(float *)(*pauVar38 + 8) + fVar6;
        auVar48._12_4_ = fVar7 * *(float *)(*pauVar38 + 0xc) + fVar6;
        auVar48._16_4_ = fVar7 * *(float *)(*pauVar38 + 0x10) + fVar6;
        auVar48._20_4_ = fVar7 * *(float *)(*pauVar38 + 0x14) + fVar6;
        auVar48._24_4_ = fVar7 * *(float *)(*pauVar38 + 0x18) + fVar6;
        auVar48._28_4_ = auVar50._28_4_ + fVar6;
        auVar50 = ZEXT3264(auVar48);
        *pauVar38 = auVar48;
        pauVar38 = pauVar38 + 1;
        lVar32 = lVar32 + 8;
      }
      auVar47 = vshufps_avx(auVar44,auVar44,0);
      in_ZMM2 = ZEXT1664(auVar47);
      auVar44 = vshufps_avx(auVar46,auVar46,0);
      for (; iVar35 + 3 < iVar31; iVar35 = iVar35 + 4) {
        auVar51._0_4_ = auVar44._0_4_ * *(float *)*pauVar38 + auVar47._0_4_;
        auVar51._4_4_ = auVar44._4_4_ * *(float *)(*pauVar38 + 4) + auVar47._4_4_;
        auVar51._8_4_ = auVar44._8_4_ * *(float *)(*pauVar38 + 8) + auVar47._8_4_;
        auVar51._12_4_ = auVar44._12_4_ * *(float *)(*pauVar38 + 0xc) + auVar47._12_4_;
        *(undefined1 (*) [16])*pauVar38 = auVar51;
        pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
        lVar32 = lVar32 + 4;
      }
      for (; (int)lVar32 < iVar31; lVar32 = lVar32 + 1) {
        fVar9 = fVar7 * *(float *)((undefined1 *)pvVar30 + lVar32 * 4) + fVar6;
        in_ZMM2 = ZEXT464((uint)fVar9);
        *(float *)((undefined1 *)pvVar30 + lVar32 * 4) = fVar9;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}